

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O1

void __thiscall icu_63::SpoofImpl::SpoofImpl(SpoofImpl *this,SpoofImpl *src,UErrorCode *status)

{
  SpoofData *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  SpoofData **in_RCX;
  void *in_R8;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__SpoofImpl_003edb50;
  this->fMagic = 0;
  this->fChecks = 0xffff;
  this->fSpoofData = (SpoofData *)0x0;
  this->fAllowedCharsSet = (UnicodeSet *)0x0;
  this->fAllowedLocales = (char *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this->fMagic = src->fMagic;
    this->fChecks = src->fChecks;
    pSVar1 = src->fSpoofData;
    if (pSVar1 != (SpoofData *)0x0) {
      in_RCX = &this->fSpoofData;
      LOCK();
      (pSVar1->fRefCount).super___atomic_base<int>._M_i =
           (pSVar1->fRefCount).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      *in_RCX = pSVar1;
    }
    iVar2 = UnicodeSet::clone(src->fAllowedCharsSet,(__fn *)src,status,(int)in_RCX,in_R8);
    this->fAllowedCharsSet = (UnicodeSet *)CONCAT44(extraout_var,iVar2);
    pcVar3 = uprv_strdup_63(src->fAllowedLocales);
    this->fAllowedLocales = pcVar3;
    if (pcVar3 == (char *)0x0 || this->fAllowedCharsSet == (UnicodeSet *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    this->fRestrictionLevel = src->fRestrictionLevel;
  }
  return;
}

Assistant:

SpoofImpl::SpoofImpl(const SpoofImpl &src, UErrorCode &status)  :
        fMagic(0), fChecks(USPOOF_ALL_CHECKS), fSpoofData(NULL), fAllowedCharsSet(NULL) , 
        fAllowedLocales(NULL) {
    if (U_FAILURE(status)) {
        return;
    }
    fMagic = src.fMagic;
    fChecks = src.fChecks;
    if (src.fSpoofData != NULL) {
        fSpoofData = src.fSpoofData->addReference();
    }
    fAllowedCharsSet = static_cast<const UnicodeSet *>(src.fAllowedCharsSet->clone());
    fAllowedLocales = uprv_strdup(src.fAllowedLocales);
    if (fAllowedCharsSet == NULL || fAllowedLocales == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    fRestrictionLevel = src.fRestrictionLevel;
}